

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_entity **pplStack_58;
  int i;
  nhdp_domain_metric_postprocessor *p_it;
  nhdp_domain_metric_postprocessor *processor;
  nhdp_domain_listener *l_it;
  nhdp_domain_listener *listener;
  nhdp_domain *d_it;
  nhdp_domain *domain;
  
  d_it = (nhdp_domain *)(_domain_list.next + -0x2a);
  plVar1 = (_domain_list.next)->next;
  while( true ) {
    listener = (nhdp_domain_listener *)(plVar1 + -0x2a);
    if ((d_it->_node).prev == _domain_list.prev) break;
    for (__tempptr._4_4_ = 0; __tempptr._4_4_ < 4; __tempptr._4_4_ = __tempptr._4_4_ + 1) {
      rfc5444_writer_unregister_addrtlvtype
                (&_protocol->writer,d_it->_metric_addrtlvs + __tempptr._4_4_);
    }
    plVar2 = (d_it->_node).prev;
    plVar3 = (d_it->_node).next;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
    (d_it->_node).prev = (list_entity *)0x0;
    (d_it->_node).next = (list_entity *)0x0;
    oonf_class_free(&_domain_class,d_it);
    d_it = (nhdp_domain *)listener;
    plVar1 = plVar1->next;
  }
  p_it = (nhdp_domain_metric_postprocessor *)&_domain_metric_postprocessor_list.next[-1].prev;
  plVar1 = (_domain_metric_postprocessor_list.next)->next;
  while( true ) {
    pplStack_58 = &plVar1[-1].prev;
    if ((p_it->_node).prev == _domain_metric_postprocessor_list.prev) break;
    nhdp_domain_metric_postprocessor_remove(p_it);
    p_it = (nhdp_domain_metric_postprocessor *)pplStack_58;
    plVar1 = plVar1->next;
  }
  l_it = (nhdp_domain_listener *)(_domain_listener_list.next + -1);
  plVar1 = (_domain_listener_list.next)->next;
  while( true ) {
    processor = (nhdp_domain_metric_postprocessor *)(plVar1 + -1);
    if ((l_it->_node).prev == _domain_listener_list.prev) break;
    nhdp_domain_listener_remove(l_it);
    l_it = (nhdp_domain_listener *)processor;
    plVar1 = plVar1->next;
  }
  oonf_class_remove(&_domain_class);
  return;
}

Assistant:

void
nhdp_domain_cleanup(void) {
  struct nhdp_domain *domain, *d_it;
  struct nhdp_domain_listener *listener, *l_it;
  struct nhdp_domain_metric_postprocessor *processor, *p_it;
  int i;

  list_for_each_element_safe(&_domain_list, domain, _node, d_it) {
    /* free allocated TLVs */
    for (i = 0; i < 4; i++) {
      rfc5444_writer_unregister_addrtlvtype(&_protocol->writer, &domain->_metric_addrtlvs[i]);
    }

    /* remove domain */
    list_remove(&domain->_node);
    oonf_class_free(&_domain_class, domain);
  }

  list_for_each_element_safe(&_domain_metric_postprocessor_list, processor, _node, p_it) {
    nhdp_domain_metric_postprocessor_remove(processor);
  }
  list_for_each_element_safe(&_domain_listener_list, listener, _node, l_it) {
    nhdp_domain_listener_remove(listener);
  }
  oonf_class_remove(&_domain_class);
}